

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_3e90a3a::OriginPubkeyProvider::Clone(OriginPubkeyProvider *this)

{
  uint32_t exp_index;
  OriginPubkeyProvider *this_00;
  pointer *__ptr;
  long in_RSI;
  pointer __p;
  long in_FS_OFFSET;
  PubkeyProvider *local_68;
  _Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false> local_60;
  _Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false> local_58;
  KeyOriginInfo local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(**(long **)(in_RSI + 0x30) + 0x58))(&local_68);
  this_00 = (OriginPubkeyProvider *)operator_new(0x40);
  exp_index = *(uint32_t *)(in_RSI + 8);
  KeyOriginInfo::KeyOriginInfo(&local_50,(KeyOriginInfo *)(in_RSI + 0x10));
  local_58._M_head_impl = local_68;
  local_68 = (PubkeyProvider *)0x0;
  OriginPubkeyProvider
            (this_00,exp_index,&local_50,
             (unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
              *)&local_58,*(bool *)(in_RSI + 0x38));
  if (local_58._M_head_impl != (PubkeyProvider *)0x0) {
    (*(local_58._M_head_impl)->_vptr_PubkeyProvider[1])();
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_50.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  local_60._M_head_impl = (OriginPubkeyProvider *)0x0;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = (_func_int **)this_00;
  std::
  unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                 *)&local_60);
  if (local_68 != (PubkeyProvider *)0x0) {
    (*local_68->_vptr_PubkeyProvider[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<OriginPubkeyProvider>(m_expr_index, m_origin, m_provider->Clone(), m_apostrophe);
    }